

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

bool __thiscall raspicam::_private::Private_Impl::startCapture(Private_Impl *this)

{
  MMAL_STATUS_T MVar1;
  uint uVar2;
  ostream *poVar3;
  MMAL_BUFFER_HEADER_T *buffer_00;
  long in_RDI;
  MMAL_BUFFER_HEADER_T *buffer;
  int q;
  int num;
  Private_Impl *in_stack_ffffffffffffffe0;
  int local_18;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x180) & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private/private_impl.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x77);
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = std::operator<<(poVar3,"startCapture");
    poVar3 = std::operator<<(poVar3," not opened.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  else {
    MVar1 = mmal_port_parameter_set_boolean(*(MMAL_PORT_T **)(in_RDI + 0xd0),0x10011,1);
    if (MVar1 == MMAL_SUCCESS) {
      uVar2 = mmal_queue_length((MMAL_QUEUE_T *)**(undefined8 **)(in_RDI + 0x20));
      for (local_18 = 0; local_18 < (int)uVar2; local_18 = local_18 + 1) {
        buffer_00 = mmal_queue_get((MMAL_QUEUE_T *)**(undefined8 **)(in_RDI + 0x20));
        if (buffer_00 == (MMAL_BUFFER_HEADER_T *)0x0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to get a required buffer");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
          poVar3 = std::operator<<(poVar3," from pool queue");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        MVar1 = mmal_port_send_buffer(*(MMAL_PORT_T **)(in_RDI + 0xd0),buffer_00);
        if (MVar1 != MMAL_SUCCESS) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "Unable to send a buffer to encoder output port ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
      *(undefined1 *)(in_RDI + 0x181) = 1;
      local_1 = true;
    }
    else {
      release(in_stack_ffffffffffffffe0);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Private_Impl::startCapture() {
            if ( !_isOpened ) {
                cerr<<__FILE__<<":"<<__LINE__<<":"<<__func__<<" not opened."<<endl;
                return false; //already opened
            }

            // start capture
            if ( mmal_port_parameter_set_boolean ( camera_video_port, MMAL_PARAMETER_CAPTURE, 1 ) != MMAL_SUCCESS ) {
                release();
                return false;
            }
            // Send all the buffers to the video port

            int num = mmal_queue_length ( State.video_pool->queue );
            int q;
            for ( q=0; q<num; q++ ) {
                MMAL_BUFFER_HEADER_T *buffer = mmal_queue_get ( State.video_pool->queue );

                if ( !buffer )
                    cerr<<"Unable to get a required buffer"<<q<<" from pool queue"<<endl;

                if ( mmal_port_send_buffer ( camera_video_port, buffer ) != MMAL_SUCCESS )
                    cerr<<"Unable to send a buffer to encoder output port "<< q<<endl;
            }
            _isCapturing=true;
            return true;
        }